

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Finalize<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::list_entry_t,duckdb::QuantileListOperation<double,false>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  long lVar1;
  idx_t iVar2;
  list_entry_t *target;
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    local_48.result_idx = 0;
    QuantileListOperation<double,false>::
    Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
              ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)
               **(undefined8 **)(states + 0x20),*(list_entry_t **)(result + 0x20),&local_48);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    lVar1 = *(long *)(states + 0x20);
    if (count != 0) {
      target = (list_entry_t *)(*(long *)(result + 0x20) + offset * 0x10);
      iVar2 = 0;
      do {
        local_48.result_idx = offset + iVar2;
        QuantileListOperation<double,false>::
        Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
                  (*(QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **)
                    (lVar1 + iVar2 * 8),target,&local_48);
        iVar2 = iVar2 + 1;
        target = target + 1;
      } while (count != iVar2);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}